

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_changed_ranges.c
# Opt level: O2

void ts_range_array_get_changed_ranges
               (TSRange *old_ranges,uint old_range_count,TSRange *new_ranges,uint new_range_count,
               TSRangeArray *differences)

{
  uint uVar1;
  uint uVar2;
  uint32_t *puVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint32_t uVar9;
  TSRange *pTVar10;
  byte bVar11;
  TSRange *pTVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  byte bVar17;
  Length start;
  Length start_00;
  Length start_01;
  Length end;
  Length end_00;
  Length end_01;
  long lStack_90;
  
  uVar13 = 0;
  bVar17 = 0;
  uVar16 = 0;
  uVar15 = 0;
  uVar7 = 0;
  uVar2 = 0;
LAB_00110cfc:
  uVar5 = (ulong)(uint)((int)uVar13 * 8);
  uVar8 = uVar16;
  uVar4 = uVar15;
  do {
    if ((old_range_count <= uVar7) && (new_range_count <= uVar2)) {
      return;
    }
    pTVar10 = old_ranges + uVar7;
    if (bVar17 == 0) {
      uVar1 = 0xffffffff;
      uVar14 = 0xffffffff00000000;
      uVar6 = uVar1;
      if (uVar7 < old_range_count) {
        puVar3 = &pTVar10->start_byte;
        lStack_90 = 4;
        pTVar12 = pTVar10;
        goto LAB_00110d85;
      }
    }
    else {
      puVar3 = &pTVar10->end_byte;
      lStack_90 = 0xc;
      pTVar12 = (TSRange *)&pTVar10->end_point;
LAB_00110d85:
      uVar1 = *puVar3;
      uVar14 = (ulong)(pTVar12->start_point).row << 0x20;
      uVar6 = *(uint *)((long)&(pTVar10->start_point).row + lStack_90);
    }
    bVar11 = (byte)uVar13;
    uVar15 = 0xffffffff;
    uVar16 = 0xffffffff00000000;
    uVar9 = uVar15;
    if (uVar2 < new_range_count || uVar13 != 0) {
      uVar9 = (&new_ranges[uVar2].start_byte)[uVar13];
      uVar15 = *(uint *)((long)&new_ranges[uVar2].start_point.column + uVar5);
      uVar16 = (ulong)*(uint *)((long)&new_ranges[uVar2].start_point.row + uVar5) << 0x20;
    }
    if (uVar9 <= uVar1) break;
    uVar14 = uVar14 | uVar1;
    if (bVar17 != bVar11) {
      start.extent.column = uVar4;
      start.bytes = (int)uVar8;
      start.extent.row = (int)(uVar8 >> 0x20);
      end.extent.column = uVar6;
      end.bytes = (int)uVar14;
      end.extent.row = (int)(uVar14 >> 0x20);
      ts_range_array_add(differences,start,end);
    }
    uVar7 = uVar7 + bVar17;
    bVar17 = bVar17 ^ 1;
    uVar8 = uVar14;
    uVar4 = uVar6;
  } while( true );
  uVar16 = uVar16 | uVar9;
  if (uVar9 < uVar1) {
    if ((bVar17 ^ bVar11) != 0) {
      start_00.extent.column = uVar4;
      start_00.bytes = (int)uVar8;
      start_00.extent.row = (int)(uVar8 >> 0x20);
      end_00.extent.column = uVar15;
      end_00.bytes = (int)uVar16;
      end_00.extent.row = (int)(uVar16 >> 0x20);
      ts_range_array_add(differences,start_00,end_00);
    }
  }
  else {
    if ((bVar17 ^ bVar11) != 0) {
      start_01.extent.column = uVar4;
      start_01.bytes = (int)uVar8;
      start_01.extent.row = (int)(uVar8 >> 0x20);
      end_01.extent.column = uVar15;
      end_01.bytes = (int)uVar16;
      end_01.extent.row = (int)(uVar16 >> 0x20);
      ts_range_array_add(differences,start_01,end_01);
    }
    uVar7 = uVar7 + bVar17;
    bVar17 = bVar17 ^ 1;
  }
  uVar2 = uVar2 + bVar11;
  uVar13 = (ulong)(bVar11 ^ 1);
  goto LAB_00110cfc;
}

Assistant:

void ts_range_array_get_changed_ranges(
  const TSRange *old_ranges, unsigned old_range_count,
  const TSRange *new_ranges, unsigned new_range_count,
  TSRangeArray *differences
) {
  unsigned new_index = 0;
  unsigned old_index = 0;
  Length current_position = length_zero();
  bool in_old_range = false;
  bool in_new_range = false;

  while (old_index < old_range_count || new_index < new_range_count) {
    const TSRange *old_range = &old_ranges[old_index];
    const TSRange *new_range = &new_ranges[new_index];

    Length next_old_position;
    if (in_old_range) {
      next_old_position = (Length) {old_range->end_byte, old_range->end_point};
    } else if (old_index < old_range_count) {
      next_old_position = (Length) {old_range->start_byte, old_range->start_point};
    } else {
      next_old_position = LENGTH_MAX;
    }

    Length next_new_position;
    if (in_new_range) {
      next_new_position = (Length) {new_range->end_byte, new_range->end_point};
    } else if (new_index < new_range_count) {
      next_new_position = (Length) {new_range->start_byte, new_range->start_point};
    } else {
      next_new_position = LENGTH_MAX;
    }

    if (next_old_position.bytes < next_new_position.bytes) {
      if (in_old_range != in_new_range) {
        ts_range_array_add(differences, current_position, next_old_position);
      }
      if (in_old_range) old_index++;
      current_position = next_old_position;
      in_old_range = !in_old_range;
    } else if (next_new_position.bytes < next_old_position.bytes) {
      if (in_old_range != in_new_range) {
        ts_range_array_add(differences, current_position, next_new_position);
      }
      if (in_new_range) new_index++;
      current_position = next_new_position;
      in_new_range = !in_new_range;
    } else {
      if (in_old_range != in_new_range) {
        ts_range_array_add(differences, current_position, next_new_position);
      }
      if (in_old_range) old_index++;
      if (in_new_range) new_index++;
      in_old_range = !in_old_range;
      in_new_range = !in_new_range;
      current_position = next_new_position;
    }
  }
}